

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_Update_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Entity_State_Update_PDU::Entity_State_Update_PDU
          (Entity_State_Update_PDU *this,EntityIdentifier *EI,Vector *EntityLinearVelocity,
          WorldCoordinates *EntityLocation,EulerAngles *EntityOrientation,EntityAppearance *EA)

{
  KFLOAT64 KVar1;
  KUINT16 KVar2;
  KFLOAT32 KVar3;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Entity_State_Update_PDU_002210a0;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00223808;
  KVar2 = (EI->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16SiteID =
       (EI->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar2;
  (this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_002234a8;
  *(undefined2 *)&(this->m_EntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EI->super_SimulationIdentifier).field_0xc;
  this->m_ui8Padding1 = '\0';
  this->m_ui8NumOfVariableParams = '\0';
  (this->m_EntityLinearVelocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223ad0;
  KVar3 = EntityLinearVelocity->m_f32Y;
  (this->m_EntityLinearVelocity).m_f32X = EntityLinearVelocity->m_f32X;
  (this->m_EntityLinearVelocity).m_f32Y = KVar3;
  (this->m_EntityLinearVelocity).m_f32Z = EntityLinearVelocity->m_f32Z;
  (this->m_EntityLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00223b28;
  KVar1 = EntityLocation->m_f64Y;
  (this->m_EntityLocation).m_f64X = EntityLocation->m_f64X;
  (this->m_EntityLocation).m_f64Y = KVar1;
  (this->m_EntityLocation).m_f64Z = EntityLocation->m_f64Z;
  (this->m_EntityOrientation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EulerAngles_002235b0;
  KVar3 = EntityOrientation->m_f32Theta;
  (this->m_EntityOrientation).m_f32Psi = EntityOrientation->m_f32Psi;
  (this->m_EntityOrientation).m_f32Theta = KVar3;
  (this->m_EntityOrientation).m_f32Phi = EntityOrientation->m_f32Phi;
  (this->m_EntityAppearance).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityAppearance_002233f8;
  (this->m_EntityAppearance).m_Appearance = EA->m_Appearance;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vVariableParameters).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = 'C';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x01';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x48;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Entity_State_Update_PDU::Entity_State_Update_PDU( const EntityIdentifier & EI, const Vector & EntityLinearVelocity,
        const WorldCoordinates & EntityLocation, const EulerAngles & EntityOrientation,
        const EntityAppearance & EA ) :
    m_ui8Padding1( 0 ),
    m_EntityID( EI ),
    m_ui8NumOfVariableParams( 0 ),
    m_EntityLinearVelocity( EntityLinearVelocity ),
    m_EntityLocation( EntityLocation ),
    m_EntityOrientation( EntityOrientation ),
    m_EntityAppearance( EA )
{
    m_ui8ProtocolFamily = Entity_Information_Interaction;
    m_ui8PDUType = EntityStateUpdate_PDU_Type;
    m_ui16PDULength = ENTITY_STATE_UPDATE_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}